

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O3

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
DeleteSubrange(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *this,int start,int num)

{
  Arena *pAVar1;
  undefined8 *puVar2;
  Rep *pRVar3;
  void **ppvVar4;
  ulong uVar5;
  
  if (start < 0) {
    RepeatedPtrField<std::__cxx11::string>::DeleteSubrange();
  }
  else if (-1 < num) {
    if (num + start <= (this->super_RepeatedPtrFieldBase).current_size_) {
      ppvVar4 = (void **)this;
      if (((ulong)(this->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
        pRVar3 = protobuf::internal::RepeatedPtrFieldBase::rep(&this->super_RepeatedPtrFieldBase);
        ppvVar4 = pRVar3->elements;
      }
      if (num != 0) {
        pAVar1 = (this->super_RepeatedPtrFieldBase).arena_;
        uVar5 = 0;
        do {
          if (pAVar1 == (Arena *)0x0) {
            puVar2 = (undefined8 *)ppvVar4[(uint)start + uVar5];
            if (puVar2 != (undefined8 *)0x0) {
              if ((long *)*puVar2 != puVar2 + 2) {
                operator_delete((long *)*puVar2,puVar2[2] + 1);
              }
            }
            operator_delete(puVar2,0x20);
          }
          uVar5 = uVar5 + 1;
        } while ((uint)num != uVar5);
      }
      UnsafeArenaExtractSubrange
                (this,start,num,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)0x0);
      return;
    }
    goto LAB_0094ff79;
  }
  RepeatedPtrField<std::__cxx11::string>::DeleteSubrange();
LAB_0094ff79:
  RepeatedPtrField<std::__cxx11::string>::DeleteSubrange();
}

Assistant:

inline void RepeatedPtrField<Element>::DeleteSubrange(int start, int num) {
  ABSL_DCHECK_GE(start, 0);
  ABSL_DCHECK_GE(num, 0);
  ABSL_DCHECK_LE(start + num, size());
  void** subrange = raw_mutable_data() + start;
  Arena* arena = GetArena();
  for (int i = 0; i < num; ++i) {
    using H = CommonHandler<TypeHandler>;
    H::Delete(static_cast<Element*>(subrange[i]), arena);
  }
  UnsafeArenaExtractSubrange(start, num, nullptr);
}